

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O2

int archive_filter_uuencode_open(archive_write_filter *f)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  archive_string *paVar4;
  int iVar5;
  ulong uVar6;
  
  puVar1 = (uint *)f->data;
  uVar6 = 0x10000;
  if (f->archive->magic == 0xb0c5c0de) {
    uVar3 = archive_write_get_bytes_per_block(f->archive);
    uVar6 = (long)(int)uVar3;
    if ((uVar3 < 0x10001) && (uVar6 = 0x10000, uVar3 != 0)) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)uVar3;
      uVar6 = 0x10000 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar2,0);
    }
  }
  *(ulong *)(puVar1 + 0xe) = uVar6;
  paVar4 = archive_string_ensure((archive_string *)(puVar1 + 8),uVar6 + 0x200);
  if (paVar4 == (archive_string *)0x0) {
    archive_set_error(f->archive,0xc,"Can\'t allocate data for uuencode buffer");
    iVar5 = -0x1e;
  }
  else {
    iVar5 = 0;
    archive_string_sprintf
              ((archive_string *)(puVar1 + 8),"begin %o %s\n",(ulong)*puVar1,
               *(undefined8 *)(puVar1 + 2));
    f->data = puVar1;
  }
  return iVar5;
}

Assistant:

static int
archive_filter_uuencode_open(struct archive_write_filter *f)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	size_t bs = 65536, bpb;

	if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
		/* Buffer size should be a multiple number of the of bytes
		 * per block for performance. */
		bpb = archive_write_get_bytes_per_block(f->archive);
		if (bpb > bs)
			bs = bpb;
		else if (bpb != 0)
			bs -= bs % bpb;
	}

	state->bs = bs;
	if (archive_string_ensure(&state->encoded_buff, bs + 512) == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for uuencode buffer");
		return (ARCHIVE_FATAL);
	}

	archive_string_sprintf(&state->encoded_buff, "begin %o %s\n",
	    (unsigned int)state->mode, state->name.s);

	f->data = state;
	return (0);
}